

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

int __thiscall
ON_UuidPairList::GetId1s(ON_UuidPairList *this,ON_SimpleArray<ON_UUID_struct> *uuid_list)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int local_20;
  int i;
  int count0;
  ON_SimpleArray<ON_UUID_struct> *uuid_list_local;
  ON_UuidPairList *this_local;
  
  iVar2 = ON_SimpleArray<ON_UUID_struct>::Count(uuid_list);
  iVar3 = ON_SimpleArray<ON_UUID_struct>::Count(uuid_list);
  ON_SimpleArray<ON_UUID_struct>::Reserve
            (uuid_list,
             (ulong)((iVar3 + (this->super_ON_SimpleArray<ON_UuidPair>).m_count) -
                    this->m_removed_count));
  for (local_20 = 0; local_20 < (this->super_ON_SimpleArray<ON_UuidPair>).m_count;
      local_20 = local_20 + 1) {
    bVar1 = ::operator==(&ON_max_uuid,(this->super_ON_SimpleArray<ON_UuidPair>).m_a[local_20].m_uuid
                        );
    if ((!bVar1) ||
       (bVar1 = ::operator==(&ON_max_uuid,
                             (this->super_ON_SimpleArray<ON_UuidPair>).m_a[local_20].m_uuid + 1),
       !bVar1)) {
      ON_SimpleArray<ON_UUID_struct>::Append
                (uuid_list,(this->super_ON_SimpleArray<ON_UuidPair>).m_a[local_20].m_uuid);
    }
  }
  iVar3 = ON_SimpleArray<ON_UUID_struct>::Count(uuid_list);
  return iVar3 - iVar2;
}

Assistant:

int ON_UuidPairList::GetId1s(
    ON_SimpleArray<ON_UUID>& uuid_list
    ) const
{
  const int count0 = uuid_list.Count();
  int i;
  uuid_list.Reserve(uuid_list.Count() + m_count - m_removed_count);
  for ( i = 0; i < m_count; i++ )
  {
    if ( ON_max_uuid == m_a[i].m_uuid[0] && ON_max_uuid == m_a[i].m_uuid[1] )
      continue;
    uuid_list.Append(m_a[i].m_uuid[0]);
  }
  return uuid_list.Count() - count0;
}